

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS ref_part_cad_data(REF_GRID ref_grid,char *filename)

{
  REF_MPI ref_mpi;
  REF_GEOM pRVar1;
  int iVar2;
  uint uVar3;
  REF_STATUS RVar4;
  size_t sVar5;
  REF_BYTE *pRVar6;
  size_t sVar7;
  __off_t _Var8;
  FILE *__stream;
  undefined8 uVar9;
  char *pcVar10;
  REF_LONG ref_private_status_reis_ai;
  REF_BOOL available;
  REF_INT version;
  REF_INT dim;
  REF_FILEPOS next_position;
  REF_FILEPOS key_pos [156];
  int local_52c;
  REF_INT local_528 [2];
  long local_520;
  REF_FILEPOS local_518 [157];
  
  ref_mpi = ref_grid->mpi;
  pRVar1 = ref_grid->geom;
  local_528[0] = -1;
  local_528[1] = 0xffffffff;
  sVar5 = strlen(filename);
  iVar2 = strcmp(filename + (sVar5 - 6),".meshb");
  if (iVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x35f,
           "ref_part_cad_data",3,"expected .meshb extension");
    return 3;
  }
  if (ref_mpi->id == 0) {
    uVar3 = ref_import_meshb_header(filename,local_528,local_518);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x363,
             "ref_part_cad_data",(ulong)uVar3,"header");
      return uVar3;
    }
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      pcVar10 = "unable to open file";
      uVar9 = 0x368;
      goto LAB_00185be0;
    }
    uVar3 = ref_import_meshb_jump((FILE *)__stream,local_528[0],local_518,3,&local_52c,&local_520);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x36b,
             "ref_part_cad_data",(ulong)uVar3,"jump");
      return uVar3;
    }
    if (local_52c == 0) {
      pcVar10 = "meshb missing dimension";
      uVar9 = 0x36c;
      goto LAB_00185b9d;
    }
    sVar5 = fread(local_528 + 1,4,1,__stream);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x36d,
             "ref_part_cad_data","dim",1,sVar5);
      return 1;
    }
  }
  else {
    __stream = (FILE *)0x0;
  }
  if (ref_grid->mpi->id == 0) {
    uVar3 = ref_import_meshb_jump
                      ((FILE *)__stream,local_528[0],local_518,0x7e,&local_52c,&local_520);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x375,
             "ref_part_cad_data",(ulong)uVar3,"jump");
      return uVar3;
    }
    if (local_52c != 0) {
      RVar4 = ref_part_meshb_size((FILE *)__stream,local_528[0],&pRVar1->cad_data_size);
      if (RVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x379,"ref_part_cad_data",1,"cad data size");
        return 1;
      }
      if (pRVar1->cad_data != (REF_BYTE *)0x0) {
        free(pRVar1->cad_data);
      }
      sVar5 = pRVar1->cad_data_size;
      pRVar6 = (REF_BYTE *)malloc(sVar5);
      pRVar1->cad_data = pRVar6;
      if (pRVar6 == (REF_BYTE *)0x0) {
        pcVar10 = "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
        uVar9 = 0x37f;
        goto LAB_00185be0;
      }
      sVar7 = fread(pRVar6,1,sVar5,__stream);
      if (sVar5 != sVar7) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",899,
               "ref_part_cad_data","cad_data",sVar5,sVar7);
        return 1;
      }
      _Var8 = ftello(__stream);
      if (local_520 != _Var8) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",900,
               "ref_part_cad_data","end location",local_520,_Var8);
        return 1;
      }
    }
  }
  uVar3 = ref_mpi_bcast(ref_mpi,&local_52c,1,1);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x387,
           "ref_part_cad_data",(ulong)uVar3,"bcast");
    return uVar3;
  }
  if (local_52c == 0) {
    pcVar10 = "GmfByteFlow keyword for cad data missing";
    uVar9 = 0x389;
LAB_00185b9d:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar9,
           "ref_part_cad_data",pcVar10);
    return 1;
  }
  uVar3 = ref_mpi_bcast(ref_mpi,&pRVar1->cad_data_size,1,1);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x38e,
           "ref_part_cad_data",(ulong)uVar3,"bcast");
    return uVar3;
  }
  if (ref_grid->mpi->id != 0) {
    if (pRVar1->cad_data != (REF_BYTE *)0x0) {
      free(pRVar1->cad_data);
    }
    pRVar6 = (REF_BYTE *)malloc(pRVar1->cad_data_size);
    pRVar1->cad_data = pRVar6;
    if (pRVar6 == (REF_BYTE *)0x0) {
      pcVar10 = "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
      uVar9 = 0x393;
LAB_00185be0:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar9,
             "ref_part_cad_data",pcVar10);
      return 2;
    }
  }
  uVar3 = ref_mpi_bcast(ref_mpi,pRVar1->cad_data,(REF_INT)pRVar1->cad_data_size,4);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x397,
           "ref_part_cad_data",(ulong)uVar3,"bcast");
    return uVar3;
  }
  if (ref_grid->mpi->id != 0) {
    return 0;
  }
  fclose(__stream);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_part_cad_data(REF_GRID ref_grid, const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *file;
  REF_INT version = REF_EMPTY, dim = REF_EMPTY;
  REF_BOOL available;
  REF_FILEPOS next_position;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_INT cad_data_keyword;
  REF_BOOL verbose = REF_FALSE;
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 6], ".meshb") != 0)
    RSS(REF_INVALID, "expected .meshb extension");

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    if (verbose) printf("meshb version %d\n", version);
    if (verbose) printf("open %s\n", filename);
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    if (verbose) printf("meshb dim %d\n", dim);
  }

  if (ref_grid_once(ref_grid)) {
    cad_data_keyword = 126; /* GmfByteFlow */
    RSS(ref_import_meshb_jump(file, version, key_pos, cad_data_keyword,
                              &available, &next_position),
        "jump");
    if (available) {
      RSS(ref_part_meshb_size(file, version,
                              &(ref_geom_cad_data_size(ref_geom))),
          "cad data size");
      if (verbose)
        printf("cad_data_size %ld\n", (long)ref_geom_cad_data_size(ref_geom));
      /* safe non-NULL free, if already allocated, to prevent mem leaks */
      ref_free(ref_geom_cad_data(ref_geom));
      ref_malloc_size_t(ref_geom_cad_data(ref_geom),
                        ref_geom_cad_data_size(ref_geom), REF_BYTE);
      REIS(ref_geom_cad_data_size(ref_geom),
           fread(ref_geom_cad_data(ref_geom), sizeof(REF_BYTE),
                 (size_t)ref_geom_cad_data_size(ref_geom), file),
           "cad_data");
      REIS(next_position, ftello(file), "end location");
    }
  }
  RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");

  RAS(available, "GmfByteFlow keyword for cad data missing");

  if (available) {
    RSS(ref_mpi_bcast(ref_mpi, &ref_geom_cad_data_size(ref_geom), 1,
                      REF_INT_TYPE),
        "bcast");
    if (!ref_grid_once(ref_grid)) {
      /* safe non-NULL free, if already allocated, to prevent mem leaks */
      ref_free(ref_geom_cad_data(ref_geom));
      ref_malloc_size_t(ref_geom_cad_data(ref_geom),
                        ref_geom_cad_data_size(ref_geom), REF_BYTE);
    }
    RSS(ref_mpi_bcast(ref_mpi, ref_geom_cad_data(ref_geom),
                      (REF_INT)ref_geom_cad_data_size(ref_geom), REF_BYTE_TYPE),
        "bcast");
  }

  if (ref_grid_once(ref_grid)) {
    fclose(file);
  }

  return REF_SUCCESS;
}